

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_bin2hex(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  undefined8 uVar1;
  undefined8 in_RAX;
  byte *pbVar2;
  byte *pbVar3;
  uchar *zIn;
  undefined1 uStack_38;
  undefined5 uStack_35;
  int nLen;
  
  if (nArg < 1) {
    jx9_result_null(pCtx);
  }
  else {
    _uStack_38 = in_RAX;
    pbVar2 = (byte *)jx9_value_to_string(*apArg,&nLen);
    if ((long)nLen < 1) {
      jx9_result_string(pCtx,"",0);
    }
    else {
      pbVar3 = pbVar2 + nLen;
      for (; uVar1 = _uStack_38, pbVar2 < pbVar3; pbVar2 = pbVar2 + 1) {
        uStack_35 = SUB85(uVar1,3);
        _uStack_38 = CONCAT12("0123456789abcdef"[*pbVar2 & 0xf],
                              CONCAT11("0123456789abcdef"[*pbVar2 >> 4],uStack_38));
        jx9_result_string(pCtx,&stack0xffffffffffffffc9,2);
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_bin2hex(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zString = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string, return */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	SyBinToHexConsumer((const void *)zString, (sxu32)nLen, HashConsumer, pCtx);
	return JX9_OK;
}